

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall ft::list<int,_ft::allocator<int>_>::reverse(list<int,_ft::allocator<int>_> *this)

{
  bool bVar1;
  size_type sVar2;
  Node *pNVar3;
  Node *pNVar4;
  node *pnVar5;
  node *pnVar6;
  undefined1 local_30 [16];
  undefined1 local_20 [8];
  iterator it;
  list<int,_ft::allocator<int>_> *this_local;
  
  it.m_node = (Node *)this;
  sVar2 = size(this);
  if (1 < sVar2) {
    begin((list<int,_ft::allocator<int>_> *)local_20);
    while( true ) {
      end((list<int,_ft::allocator<int>_> *)local_30);
      bVar1 = operator!=((listIterator<int> *)local_20,(listIterator<int> *)local_30);
      listIterator<int>::~listIterator((listIterator<int> *)local_30);
      if (!bVar1) break;
      pNVar3 = listIterator<int>::node((listIterator<int> *)local_20);
      pNVar4 = listIterator<int>::node((listIterator<int> *)local_20);
      swap<ft::listNode<int>*>(&pNVar3->prev,&pNVar4->next);
      listIterator<int>::operator--((listIterator<int> *)local_20);
    }
    listIterator<int>::~listIterator((listIterator<int> *)local_20);
    swap<ft::listNode<int>*>(&this->m_head,&this->m_tail);
    pnVar5 = head(this);
    pnVar6 = head(this);
    swap<ft::listNode<int>*>(&pnVar5->prev,&pnVar6->next);
    pnVar5 = tail(this);
    pnVar6 = tail(this);
    swap<ft::listNode<int>*>(&pnVar5->prev,&pnVar6->next);
  }
  return;
}

Assistant:

void reverse() {
		if (this->size() > 1) {
			for (iterator it = this->begin(); it != this->end(); --it)
				ft::swap(it.node()->prev, it.node()->next);
			ft::swap(this->m_head, this->m_tail);
			ft::swap(this->head()->prev, this->head()->next);
			ft::swap(this->tail()->prev, this->tail()->next);
		}
	}